

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

LispPTR dremove(LispPTR x,LispPTR l)

{
  DLword *pDVar1;
  LispPTR LVar2;
  LispPTR local_14;
  LispPTR z;
  LispPTR l_local;
  LispPTR x_local;
  
  if ((*(ushort *)((ulong)(MDStypetbl + (l >> 9)) ^ 2) & 0x7ff) == 5) {
    LVar2 = car(l);
    local_14 = l;
    if (x == LVar2) {
      LVar2 = cdr(l);
      if (LVar2 == 0) {
        l_local = 0;
      }
      else {
        LVar2 = cdr(l);
        LVar2 = car(LVar2);
        rplaca(l,LVar2);
        LVar2 = cdr(l);
        LVar2 = cdr(LVar2);
        rplacd(l,LVar2);
        l_local = dremove(x,l);
      }
    }
    else {
      while (pDVar1 = MDStypetbl, LVar2 = cdr(local_14), l_local = l,
            (*(ushort *)((ulong)(pDVar1 + (LVar2 >> 9)) ^ 2) & 0x7ff) == 5) {
        LVar2 = cdr(local_14);
        LVar2 = car(LVar2);
        if (x == LVar2) {
          LVar2 = cdr(local_14);
          LVar2 = cdr(LVar2);
          rplacd(local_14,LVar2);
        }
        else {
          local_14 = cdr(local_14);
        }
      }
    }
  }
  else {
    l_local = 0;
  }
  return l_local;
}

Assistant:

static LispPTR dremove(LispPTR x, LispPTR l) {
  LispPTR z;

  if (Listp(l) == NIL)
    return (NIL);
  else if (x == car(l)) {
    if (cdr(l) != NIL) {
      rplaca(l, car(cdr(l)));
      rplacd(l, cdr(cdr(l)));
      return (dremove(x, l));
    } else 
        return (NIL);
  } else {
    z = l;
  lp:
    if (Listp(cdr(l)) == NIL)
      return (z);
    else if (x == car(cdr(l)))
      rplacd(l, cdr(cdr(l)));
    else
      l = cdr(l);
    goto lp;
  }
}